

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

bool __thiscall
ColumnSampler<double>::sample_col
          (ColumnSampler<double> *this,size_t *col,Xoshiro256PP *rnd_generator)

{
  double *pdVar1;
  pointer pdVar2;
  long lVar3;
  result_type rVar4;
  size_t sVar5;
  ulong uVar6;
  _Adaptor<Xoshiro::Xoshiro256PP,_double> __aurng;
  double dVar7;
  double dVar8;
  uniform_int_distribution<unsigned_long> local_38;
  
  pdVar1 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 == (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    sVar5 = this->curr_pos;
    if (sVar5 == 0) {
      return false;
    }
    if (sVar5 == 1) {
      this->last_given = 0;
      sVar5 = *(this->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      local_38._M_param._M_b = sVar5 - 1;
      local_38._M_param._M_a = 0;
      rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_38,rnd_generator,&local_38._M_param);
      this->last_given = rVar4;
      sVar5 = (this->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[rVar4];
    }
  }
  else {
    dVar8 = *pdVar1;
    if (dVar8 <= 0.0) {
      return false;
    }
    if (this->tree_levels == 0) {
      lVar3 = 0;
    }
    else {
      uVar6 = 0;
      lVar3 = 0;
      do {
        dVar7 = std::generate_canonical<double,53ul,Xoshiro::Xoshiro256PP>(rnd_generator);
        pdVar2 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar3 = (lVar3 * 2 + 2) - (ulong)(dVar7 * dVar8 + 0.0 < pdVar2[lVar3 * 2 + 1]);
        dVar8 = pdVar2[lVar3];
        uVar6 = uVar6 + 1;
      } while (uVar6 < this->tree_levels);
    }
    sVar5 = lVar3 - this->offset;
  }
  *col = sVar5;
  return true;
}

Assistant:

bool ColumnSampler<ldouble_safe>::sample_col(size_t &col, RNG_engine &rnd_generator)
{
    if (!this->has_weights())
    {
        switch(this->curr_pos)
        {
            case 0: return false;
            case 1:
            {
                this->last_given = 0;
                col = this->col_indices[0];
                return true;
            }
            default:
            {
                this->last_given = std::uniform_int_distribution<size_t>(0, this->curr_pos-1)(rnd_generator);
                col = this->col_indices[this->last_given];
                return true;
            }
        }
    }

    else
    {
        /* TODO: here could instead generate only 1 random number from zero to the full weight,
           and then subtract from it as it goes down every level. Would have less precision
           but should still work fine. */
        size_t curr_ix = 0;
        double rnd_subrange, w_left;
        double curr_subrange = this->tree_weights[0];
        if (curr_subrange <= 0)
            return false;

        for (size_t lev = 0; lev < tree_levels; lev++)
        {
            rnd_subrange = std::uniform_real_distribution<double>(0., curr_subrange)(rnd_generator);
            w_left = this->tree_weights[ix_child(curr_ix)];
            curr_ix = ix_child(curr_ix) + (rnd_subrange >= w_left);
            curr_subrange = this->tree_weights[curr_ix];
        }

        col = curr_ix - this->offset;
        return true;
    }
}